

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

UColAttributeValue __thiscall
icu_63::RuleBasedCollator::getAttribute
          (RuleBasedCollator *this,UColAttribute attr,UErrorCode *errorCode)

{
  UColAttributeValue UVar1;
  uint uVar2;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    switch(attr) {
    case UCOL_FRENCH_COLLATION:
      uVar2 = 0x800;
      break;
    case UCOL_ALTERNATE_HANDLING:
      return (uint)((this->settings->options & 0xc) == 0) + UCOL_SHIFTED;
    case UCOL_CASE_FIRST:
      uVar2 = this->settings->options & 0x300;
      UVar1 = UCOL_OFF;
      if (uVar2 != 0) {
        UVar1 = (uint)(uVar2 == 0x200) ^ UCOL_UPPER_FIRST;
      }
      return UVar1;
    case UCOL_CASE_LEVEL:
      uVar2 = 0x400;
      break;
    case UCOL_DECOMPOSITION_MODE:
      uVar2 = 1;
      break;
    case UCOL_STRENGTH:
      return this->settings->options >> 0xc;
    case UCOL_HIRAGANA_QUATERNARY_MODE:
      return UCOL_OFF;
    case UCOL_NUMERIC_COLLATION:
      uVar2 = 2;
      break;
    default:
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return UCOL_DEFAULT;
    }
    return UCOL_ON - (uint)((uVar2 & this->settings->options) == 0);
  }
  return UCOL_DEFAULT;
}

Assistant:

UColAttributeValue
RuleBasedCollator::getAttribute(UColAttribute attr, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return UCOL_DEFAULT; }
    int32_t option;
    switch(attr) {
    case UCOL_FRENCH_COLLATION:
        option = CollationSettings::BACKWARD_SECONDARY;
        break;
    case UCOL_ALTERNATE_HANDLING:
        return settings->getAlternateHandling();
    case UCOL_CASE_FIRST:
        return settings->getCaseFirst();
    case UCOL_CASE_LEVEL:
        option = CollationSettings::CASE_LEVEL;
        break;
    case UCOL_NORMALIZATION_MODE:
        option = CollationSettings::CHECK_FCD;
        break;
    case UCOL_STRENGTH:
        return (UColAttributeValue)settings->getStrength();
    case UCOL_HIRAGANA_QUATERNARY_MODE:
        // Deprecated attribute, unsettable.
        return UCOL_OFF;
    case UCOL_NUMERIC_COLLATION:
        option = CollationSettings::NUMERIC;
        break;
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_DEFAULT;
    }
    return ((settings->options & option) == 0) ? UCOL_OFF : UCOL_ON;
}